

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O0

void __thiscall CFFFileInput::~CFFFileInput(CFFFileInput *this)

{
  CFFFileInput *this_local;
  
  (this->super_Type2InterpreterImplementationAdapter).super_IType2InterpreterImplementation.
  _vptr_IType2InterpreterImplementation = (_func_int **)&PTR_ReadCharString_0054d070;
  FreeData(this);
  std::__cxx11::list<IndexElement_*,_std::allocator<IndexElement_*>_>::~list
            (&this->mAdditionalGlyphs);
  std::
  map<const_char_*,_unsigned_short,_StringLess,_std::allocator<std::pair<const_char_*const,_unsigned_short>_>_>
  ::~map(&this->mStringToSID);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
  ::~map(&this->mNameToIndex);
  CFFPrimitiveReader::~CFFPrimitiveReader(&this->mPrimitivesReader);
  std::vector<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>::~vector(&this->mEncodings);
  std::vector<CharSetInfo_*,_std::allocator<CharSetInfo_*>_>::~vector(&this->mCharSets);
  std::
  map<long_long,_CharStrings_*,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_CharStrings_*>_>_>
  ::~map(&this->mLocalSubrs);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list(&this->mName);
  return;
}

Assistant:

CFFFileInput::~CFFFileInput(void)
{
	FreeData();
}